

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

Result __thiscall
tonk::gateway::SSDPRequester::OnUDPDatagram(SSDPRequester *this,char *data,uint bytes)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  StateMachine *pSVar5;
  long lVar6;
  uint in_ECX;
  undefined4 in_register_00000014;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Result *success;
  undefined8 uVar10;
  Result result;
  string url;
  string line;
  ParsedURL parsed;
  membuf sbuf;
  istream is;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_3_a3f0114d_for___in6_u local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined **local_188;
  long local_180;
  long lStack_178;
  long lStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  locale local_150 [8];
  long local_148 [2];
  ios_base local_138 [264];
  
  lVar6 = CONCAT44(in_register_00000014,bytes);
  local_188 = (undefined **)__assert_fail;
  local_180 = 0;
  lStack_178 = 0;
  local_280._8_8_ = __assert_fail;
  lStack_170 = 0;
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  std::locale::locale(local_150);
  local_188 = &PTR__streambuf_001b7898;
  local_180 = lVar6;
  lStack_178 = lVar6;
  lStack_170 = (ulong)in_ECX + lVar6;
  std::istream::istream((istream *)local_148,(streambuf *)&local_188);
  local_250._M_allocated_capacity = (size_type)local_240;
  local_250._8_8_ = 0;
  local_240[0] = 0;
  cVar2 = std::ios::widen((char)(istream *)local_148 + (char)*(undefined8 *)(local_148[0] + -0x18));
  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_148,(string *)local_250._M_local_buf,cVar2);
  if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
    lVar6 = std::__cxx11::string::find(local_250._M_local_buf,0x1966c7,0);
    if (lVar6 == -1) {
      local_230._M_allocated_capacity = (size_type)&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Ignoring malformed UDP response (No \"200 OK\")","");
      pSVar5 = (StateMachine *)operator_new(0x38);
      pSVar5->Host = (AsioHost *)0x0;
      pSVar5->SSDP = (SSDPRequester *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar5->SSDP,local_230._M_allocated_capacity,
                 (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
      goto LAB_0013a3da;
    }
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_148[0] + -0x18) +
                              (char)(istream *)local_148);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_148,(string *)local_250._M_local_buf,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        local_230._M_allocated_capacity = (size_type)&local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"No location found","")
        ;
        pSVar5 = (StateMachine *)operator_new(0x38);
        pSVar5->Host = (AsioHost *)0x0;
        pSVar5->SSDP = (SSDPRequester *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pSVar5->SSDP,local_230._M_allocated_capacity,
                   (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
        goto LAB_0013a6e9;
      }
      std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_250);
      uVar1 = local_230._M_allocated_capacity;
      iVar3 = strcasecmp((char *)local_230._M_allocated_capacity,"location:");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar1 != &local_220) {
        operator_delete((void *)uVar1);
      }
    } while (iVar3 != 0);
    lVar6 = std::__cxx11::string::find(local_250._M_local_buf,0x196706,0);
    if (lVar6 == -1) {
      local_230._M_allocated_capacity = (size_type)&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Ignoring malformed UDP response (No protocol)","");
      pSVar5 = (StateMachine *)operator_new(0x38);
      pSVar5->Host = (AsioHost *)0x0;
      pSVar5->SSDP = (SSDPRequester *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar5->SSDP,local_230._M_allocated_capacity,
                 (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
LAB_0013a6e9:
      *(undefined4 *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
      (pSVar5->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x2;
      this->State = pSVar5;
      paVar9 = &local_220;
      local_270._M_allocated_capacity = local_230._M_allocated_capacity;
    }
    else {
      std::__cxx11::string::string
                ((string *)(local_280 + 0x10),(string *)local_250._M_local_buf,lVar6 + 3,
                 (allocator *)local_230._M_local_buf);
      uVar1 = local_270._M_allocated_capacity;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_270._M_allocated_capacity + local_270._8_8_);
      uVar10 = local_270._M_allocated_capacity;
      if (0 < (long)local_270._8_8_ >> 2) {
        lVar6 = ((long)local_270._8_8_ >> 2) + 1;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_270._M_allocated_capacity + 3);
        uVar10 = (local_270._8_8_ & 0xfffffffffffffffc) + local_270._M_allocated_capacity;
        do {
          iVar3 = isspace((int)paVar7->_M_local_buf[-3]);
          if (iVar3 == 0) {
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + -3);
            goto LAB_0013a771;
          }
          iVar3 = isspace((int)paVar7->_M_local_buf[-2]);
          if (iVar3 == 0) {
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + -2);
            goto LAB_0013a771;
          }
          iVar3 = isspace((int)paVar7->_M_local_buf[-1]);
          if (iVar3 == 0) {
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + -1);
            goto LAB_0013a771;
          }
          iVar3 = isspace((int)paVar7->_M_local_buf[0]);
          if (iVar3 == 0) goto LAB_0013a771;
          lVar6 = lVar6 + -1;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + 4);
        } while (1 < lVar6);
      }
      lVar6 = (long)paVar9 - uVar10;
      if (lVar6 == 1) {
LAB_0013a74e:
        iVar3 = isspace((int)*(char *)uVar10);
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar10;
        if (iVar3 != 0) {
          paVar7 = paVar9;
        }
LAB_0013a771:
        if (paVar9 == paVar7) goto LAB_0013a78a;
        std::__cxx11::string::_M_erase((ulong)(local_280 + 0x10),0);
      }
      else {
        if (lVar6 == 2) {
LAB_0013a73e:
          iVar3 = isspace((int)*(char *)uVar10);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)uVar10;
          if (iVar3 != 0) {
            uVar10 = uVar10 + 1;
            goto LAB_0013a74e;
          }
          goto LAB_0013a771;
        }
        if (lVar6 == 3) {
          iVar3 = isspace((int)*(char *)uVar10);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)uVar10;
          if (iVar3 != 0) {
            uVar10 = uVar10 + 1;
            goto LAB_0013a73e;
          }
          goto LAB_0013a771;
        }
LAB_0013a78a:
        local_270._8_8_ = 0;
        *(char *)uVar1 = '\0';
      }
      uVar1 = local_270._M_allocated_capacity;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_270._M_allocated_capacity + local_270._8_8_);
      lVar6 = (long)local_270._8_8_ >> 2;
      paVar7 = paVar9;
      if (0 < lVar6) {
        lVar8 = lVar6 + 1;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar9->_M_local_buf + -(local_270._8_8_ & 0xfffffffffffffffc));
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar9->_M_local_buf + lVar6 * -4);
        uVar10 = local_270._8_8_;
        do {
          iVar3 = isspace((int)((char *)(uVar1 - 1))[uVar10]);
          if (iVar3 == 0) {
            uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar10 + uVar1);
            goto LAB_0013a8b2;
          }
          iVar3 = isspace((int)((char *)(uVar1 - 2))[uVar10]);
          if (iVar3 == 0) {
            uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((char *)(uVar1 - 1) + uVar10);
            goto LAB_0013a8b2;
          }
          iVar3 = isspace((int)((char *)(uVar1 - 3))[uVar10]);
          if (iVar3 == 0) {
            uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((char *)(uVar1 - 2) + uVar10);
            goto LAB_0013a8b2;
          }
          iVar3 = isspace((int)((char *)(uVar1 - 4))[uVar10]);
          if (iVar3 == 0) {
            uVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((char *)(uVar1 - 3) + uVar10);
            goto LAB_0013a8b2;
          }
          uVar10 = uVar10 - 4;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      lVar6 = (long)paVar7 - uVar1;
      if (lVar6 == 1) {
LAB_0013a87f:
        iVar3 = isspace((int)paVar7->_M_local_buf[-1]);
        uVar10 = paVar7;
        if (iVar3 != 0) {
          uVar10 = uVar1;
        }
      }
      else if (lVar6 == 2) {
LAB_0013a867:
        iVar3 = isspace((int)paVar7->_M_local_buf[-1]);
        uVar10 = paVar7;
        if (iVar3 != 0) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar9->_M_local_buf + -1);
          goto LAB_0013a87f;
        }
      }
      else {
        uVar10 = uVar1;
        if ((lVar6 == 3) &&
           (iVar3 = isspace((int)paVar7->_M_local_buf[-1]), uVar10 = paVar7, iVar3 != 0)) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar9->_M_local_buf + -1);
          paVar9 = paVar7;
          goto LAB_0013a867;
        }
      }
LAB_0013a8b2:
      local_270._8_8_ = uVar10 - uVar1;
      local_230._M_allocated_capacity = (size_type)&local_220;
      *(char *)uVar10 = '\0';
      local_230._8_8_ = 0;
      local_220._M_local_buf[0] = '\0';
      local_210._8_8_ = 0;
      local_200[0]._M_local_buf[0] = '\0';
      local_200[1]._8_8_ = 0;
      local_1e0._M_local_buf[0] = '\0';
      local_1c8 = 0;
      uStack_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      local_1a0 = ZEXT416(0) << 0x40;
      local_190 = 0;
      local_1a8 = 2;
      local_210._0_8_ = local_200;
      local_200[1]._0_8_ = &local_1e0;
      ParsedURL::Parse((ParsedURL *)local_280,(string *)&local_230);
      if ((StateMachine *)local_280._0_8_ == (StateMachine *)0x0) {
        StateMachine::OnSSDPResponse(*(StateMachine **)data,(ParsedURL *)&local_230);
        this->State = (StateMachine *)0x0;
      }
      else {
        this->State = (StateMachine *)local_280._0_8_;
        local_280._0_8_ = (StateMachine *)0x0;
      }
      Result::~Result((Result *)local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200[1]._0_8_ != &local_1e0) {
        operator_delete((void *)local_200[1]._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_allocated_capacity != &local_220) {
        operator_delete((void *)local_230._M_allocated_capacity);
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_280 + 0x20);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_allocated_capacity == paVar9) goto LAB_0013a404;
  }
  else {
    local_230._M_allocated_capacity = (size_type)&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"Truncated UDP response","");
    pSVar5 = (StateMachine *)operator_new(0x38);
    pSVar5->Host = (AsioHost *)0x0;
    pSVar5->SSDP = (SSDPRequester *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar5->SSDP,local_230._M_allocated_capacity,
               (char *)(local_230._8_8_ + local_230._M_allocated_capacity));
LAB_0013a3da:
    *(undefined4 *)((long)&(pSVar5->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
    (pSVar5->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x2;
    this->State = pSVar5;
    local_270._M_allocated_capacity = local_230._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_allocated_capacity == &local_220) goto LAB_0013a404;
  }
  operator_delete((void *)local_270._M_allocated_capacity);
LAB_0013a404:
  if ((undefined1 *)local_250._M_allocated_capacity != local_240) {
    operator_delete((void *)local_250._M_allocated_capacity);
  }
  local_148[0] = _VTT;
  *(undefined8 *)((long)local_148 + *(long *)(_VTT + -0x18)) = _pthread_setaffinity_np;
  local_148[1] = 0;
  std::ios_base::~ios_base(local_138);
  local_188 = (undefined **)local_280._8_8_;
  std::locale::~locale(local_150);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::OnUDPDatagram(char* data, unsigned bytes)
{
    membuf sbuf(data, data + bytes);
    std::istream is(&sbuf);

    std::string line;

    // Check if response starts with a success code
    if (!std::getline(is, line)) {
        return Result("Truncated UDP response");
    }
    if (line.find("200 OK") == std::string::npos) {
        return Result("Ignoring malformed UDP response (No \"200 OK\")");
    }

    //ModuleLogger.Info("**** ", SourceAddress.address().to_string(), ":", SourceAddress.port());

    // For each remaining line:
    while (std::getline(is, line))
    {
        //ModuleLogger.Info("LINE: ", line);

        const bool isLocation = (0 == StrCaseCompare(line.substr(0, 9).c_str(), "location:"));
        if (!isLocation) {
            continue;
        }

        // Parse out the first HTTP or HTTPS URL in the response.
        const std::string::size_type begin = line.find("://");
        if (begin == std::string::npos) {
            return Result("Ignoring malformed UDP response (No protocol)");
        }
        std::string url(line, begin + 3);
        trim(url);

        ParsedURL parsed;
        Result result = parsed.Parse(url);
        if (result.IsFail()) {
            return result;
        }

        State->OnSSDPResponse(parsed);
        return Result::Success();
    }

    return Result("No location found");
}